

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

error confirm_type(token *token,token_type type)

{
  char *pcVar1;
  char *pcVar2;
  token_type in_EDX;
  undefined4 in_register_00000034;
  token *token_00;
  string_view sVar3;
  
  token_00 = (token *)CONCAT44(in_register_00000034,type);
  if (token_00->type == in_EDX) {
    token->filename = (char *)0x0;
  }
  else if (token_00->type == none) {
    pcVar1 = name(in_EDX);
    fail(token,(char *)token_00,"expected \x1b[1m%s\x1b[0m",pcVar1);
  }
  else {
    sVar3 = info(token_00);
    pcVar1 = name(in_EDX);
    pcVar2 = name(token_00->type);
    fail(token,(char *)token_00,"expected \x1b[1m%s\x1b[0m and got \x1b[1m%s %.*s\x1b[0m",pcVar1,
         pcVar2,sVar3._M_len & 0xffffffff,sVar3._M_str);
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)token;
}

Assistant:

error confirm_type(const token& token, token_type type)
{
    if (token.type == type) {
        return {};
    }
    if (token.type == token_type::none) {
        return fail(token, "expected \33[1m%s\33[0m", name(type));
    }
    const std::string_view tkninfo = info(token);
    return fail(token, "expected \33[1m%s\33[0m and got \33[1m%s %.*s\33[0m", name(type),
                name(token.type), static_cast<int>(std::size(tkninfo)), std::data(tkninfo));
}